

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  upb_Arena *a;
  upb_SubCounts uVar1;
  _Bool _Var2;
  upb_MiniTableField *puVar3;
  upb_MiniTable *puVar4;
  upb_MiniTableSubInternal *ptr;
  void *ptr_00;
  ulong uVar5;
  upb_MiniTableField *puVar6;
  uint uVar7;
  char *__assertion;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  upb_SubCounts sub_counts;
  
  if (0x1555555555555555 < len) {
    upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
  }
  puVar3 = (upb_MiniTableField *)upb_Arena_Malloc(d->arena,len * 0xc);
  d->fields = puVar3;
  upb_MdDecoder_CheckOutOfMemory(&d->base,puVar3);
  sub_counts.submsg_count = 0;
  sub_counts.subenum_count = 0;
  puVar4 = d->table;
  puVar4->field_count_dont_copy_me__upb_internal_use_only = 0;
  puVar3 = d->fields;
  puVar4->fields_dont_copy_me__upb_internal_use_only = puVar3;
  upb_MtDecoder_Parse(d,data,len,puVar3,0xc,
                      &d->table->field_count_dont_copy_me__upb_internal_use_only,&sub_counts);
  puVar3 = d->fields;
  if (puVar3 == (upb_MiniTableField *)0x0) {
    __assertion = "ptr";
    uVar7 = 0x47;
  }
  else {
    puVar4 = d->table;
    if (puVar4->field_count_dont_copy_me__upb_internal_use_only <= len) {
      uVar5 = (ulong)((uint)puVar4->field_count_dont_copy_me__upb_internal_use_only * 0xc + 7 &
                     0xfffffff8);
      uVar9 = len * 0xc + 7 & 0xfffffffffffffff8;
      if (uVar5 != uVar9) {
        a = d->arena;
        if ((char *)((long)&puVar3->number_dont_copy_me__upb_internal_use_only + uVar9) ==
            a->ptr_dont_copy_me__upb_internal_use_only) {
          a->ptr_dont_copy_me__upb_internal_use_only =
               (char *)((long)&puVar3->number_dont_copy_me__upb_internal_use_only + uVar5);
        }
        else {
          _Var2 = _upb_Arena_WasLastAlloc(a,puVar3,uVar9);
          if (!_Var2) {
            __assertion = "_upb_Arena_WasLastAlloc(a, ptr, oldsize)";
            uVar7 = 0x58;
            goto LAB_002ac598;
          }
          puVar4 = d->table;
          puVar3 = d->fields;
        }
      }
      uVar1 = sub_counts;
      puVar4->fields_dont_copy_me__upb_internal_use_only = puVar3;
      uVar8 = (uint)sub_counts & 0xffff;
      uVar9 = (ulong)uVar8;
      uVar7 = ((uint)sub_counts >> 0x10) + uVar8;
      uVar10 = (uint)sub_counts & 0xffff;
      ptr = (upb_MiniTableSubInternal *)upb_Arena_Malloc(d->arena,(ulong)(uVar7 * 8));
      ptr_00 = upb_Arena_Malloc(d->arena,(ulong)(uVar10 << 3));
      upb_MdDecoder_CheckOutOfMemory(&d->base,ptr);
      upb_MdDecoder_CheckOutOfMemory(&d->base,ptr_00);
      for (uVar5 = 0; uVar8 * 8 != uVar5; uVar5 = uVar5 + 8) {
        *(upb_MiniTable **)((long)ptr_00 + uVar5) =
             &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
        *(ulong *)((long)ptr + uVar5) = (long)ptr_00 + uVar5;
      }
      puVar4 = d->table;
      if (0xffff < (uint)uVar1) {
        puVar3 = d->fields;
        puVar6 = puVar3 + puVar4->field_count_dont_copy_me__upb_internal_use_only;
        for (; puVar3 < puVar6; puVar3 = puVar3 + 1) {
          if (puVar3->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e') {
            puVar3->submsg_index_dont_copy_me__upb_internal_use_only =
                 puVar3->submsg_index_dont_copy_me__upb_internal_use_only + uVar1.submsg_count;
          }
        }
        for (; uVar9 < uVar7; uVar9 = uVar9 + 1) {
          ptr[uVar9].submsg_dont_copy_me__upb_internal_use_only = (upb_MiniTable **)0x0;
        }
        puVar4 = d->table;
      }
      puVar4->subs_dont_copy_me__upb_internal_use_only = ptr;
      return;
    }
    __assertion = "size <= oldsize";
    uVar7 = 0x48;
  }
LAB_002ac598:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                ,uVar7,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  if (SIZE_MAX / sizeof(*d->fields) < len) {
    upb_MdDecoder_ErrorJmp(&d->base, "Out of memory");
  }
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}